

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O0

int minTemp3_fast(word *pInOut,int iVar,int start,int finish,int iQ,int jQ,int *pDifStart)

{
  char cVar1;
  int iVar2;
  ulong x;
  word temp;
  int local_30;
  int blockSize;
  int i;
  int jQ_local;
  int iQ_local;
  int finish_local;
  int start_local;
  int iVar_local;
  word *pInOut_local;
  
  iVar2 = 1 << ((byte)iVar & 0x1f);
  local_30 = start;
  while( true ) {
    if (local_30 < finish) {
      *pDifStart = 0;
      return 0;
    }
    if (0x3f < jQ * iVar2) break;
    cVar1 = (char)iVar2;
    x = (pInOut[local_30] & SFmask[iVar][iQ]) << ((char)iQ * cVar1 & 0x3fU) ^
        (pInOut[local_30] & SFmask[iVar][jQ]) << ((char)jQ * cVar1 & 0x3fU);
    if (x != 0) {
      iVar2 = firstShiftWithOneBit(x,iVar2);
      *pDifStart = (local_30 * 100 + 0x14) - iVar2;
      if ((pInOut[local_30] & SFmask[iVar][iQ]) << ((char)iQ * cVar1 & 0x3fU) <=
          (pInOut[local_30] & SFmask[iVar][jQ]) << ((char)jQ * cVar1 & 0x3fU)) {
        return 0;
      }
      return 1;
    }
    local_30 = local_30 + -1;
  }
  __assert_fail("jQ*blockSize < 64",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bool/lucky/luckyFast16.c"
                ,0xd3,"int minTemp3_fast(word *, int, int, int, int, int, int *)");
}

Assistant:

int minTemp3_fast(word* pInOut, int iVar, int start, int finish, int iQ, int jQ, int* pDifStart)
{
    int i, blockSize = 1<<iVar;
    word temp;
    for(i=start; i>=finish; i--)
    {
        assert( jQ*blockSize < 64 );
        temp = ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) ^ ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize));
        if( temp == 0)
            continue;
        else
        {
            *pDifStart = i*100 + 20 - firstShiftWithOneBit(temp, blockSize);
            if( ((pInOut[i] & SFmask[iVar][iQ])<<(iQ*blockSize)) <= ((pInOut[i] & SFmask[iVar][jQ])<<(jQ*blockSize)) )
                return 0;
            else
                return 1;
        }
    }
    *pDifStart=0;
    return 0;
}